

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  uint64_t *puVar1;
  Block *pBVar2;
  Expression *pEVar3;
  pool_ref<soul::heart::Expression> local_48;
  pool_ref<soul::heart::Expression> *local_40;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArgListType *__range2;
  Branch *b;
  Branch *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->newModule;
  b = (Branch *)__fn;
  old_local = (Branch *)this;
  pBVar2 = pool_ref::operator_cast_to_Block_((pool_ref *)(__fn + 0x18));
  pBVar2 = getRemappedBlock(this,pBVar2);
  __range2 = (ArgListType *)
             Module::allocate<soul::heart::Branch,soul::heart::Block&>(this_00,pBVar2);
  __begin2 = (pool_ref<soul::heart::Expression> *)&b->targetArgs;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                      __begin2);
  arg = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                  ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)__begin2)
  ;
  for (; __end2 != arg; __end2 = __end2 + 1) {
    local_40 = __end2;
    puVar1 = __range2->space;
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
    pEVar3 = cloneExpression(this,pEVar3);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_48,pEVar3);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)(puVar1 + 1),
               &local_48);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_48);
  }
  return (int)__range2;
}

Assistant:

heart::Branch& clone (const heart::Branch& old)
    {
        auto& b = newModule.allocate<heart::Branch> (getRemappedBlock (old.target));

        for (auto& arg : old.targetArgs)
            b.targetArgs.push_back (cloneExpression (arg));

        return b;
    }